

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_text_to_content_json.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppbVar1;
  iterator j_00;
  uint uVar2;
  char *path;
  MzpArchiveEntry MVar3;
  pointer pMVar4;
  pointer puVar5;
  undefined8 uVar6;
  bool bVar7;
  reference pvVar8;
  char *pcVar9;
  json_value jVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  undefined1 auVar16 [8];
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  undefined1 local_218 [8];
  Mzp mzp;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  string digest_bytes;
  string digest_hex;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  undefined8 local_138;
  string *local_130;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_128;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  undefined8 local_100;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  string_data;
  json j;
  string serialized_json;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  undefined8 local_90;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> string_data_offsets;
  undefined1 local_58 [8];
  string script_text_raw;
  
  if (argc != 3) {
    main_cold_1();
    return -1;
  }
  pcVar14 = argv[1];
  path = argv[2];
  local_58 = (undefined1  [8])&script_text_raw._M_string_length;
  script_text_raw._M_dataplus._M_p = (pointer)0x0;
  script_text_raw._M_string_length._0_1_ = 0;
  bVar7 = mg::fs::read_file(pcVar14,(string *)local_58);
  if (!bVar7) {
    fprintf(_stderr,"Failed to read script text from \'%s\'\n",pcVar14);
    iVar12 = -1;
    goto LAB_0010ae2d;
  }
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mzp.header.magic[0] = '\0';
  mzp.header.magic[1] = '\0';
  mzp.header.magic[2] = '\0';
  mzp.header.magic[3] = '\0';
  mzp.header.magic[4] = '\0';
  mzp.header.magic[5] = '\0';
  mzp.header.archive_entry_count = 0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar7 = mg::data::mzp_read((string *)local_58,(Mzp *)local_218);
  if (bVar7) {
    if ((ulong)((long)mzp.entry_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start -
               (long)mzp.entry_headers.
                     super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) < 0x21) {
      main_cold_3();
      goto LAB_0010ae93;
    }
    MVar3 = *mzp.entry_headers.
             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar13 = (ulong)mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[1] >> 2;
    auStack_88 = (undefined1  [8])0x0;
    string_data_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    string_data_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,uVar13 & 0xffffffff
              );
    puVar5 = string_data_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar4 = mzp.entry_headers.
             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((int)uVar13 != 0) {
      uVar11 = 0;
      do {
        uVar2 = *(uint *)((long)MVar3 + uVar11 * 4);
        *(uint *)((long)auStack_88 + uVar11 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar11 = uVar11 + 1;
      } while ((uVar13 & 0xffffffff) != uVar11);
    }
    auStack_f8 = (undefined1  [8])0x0;
    string_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    string_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (auStack_88 !=
        (undefined1  [8])
        string_data_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar14 = (char *)((long)mzp.entry_headers.
                               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[4] +
                         (long)mzp.entry_headers.
                               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[5] + -1);
      auVar16 = auStack_88;
      do {
        j.m_value.object = (object_t *)((long)pMVar4[4] + (ulong)*(uint *)auVar16);
        pcVar9 = (char *)((ulong)*(uint *)auVar16 + (long)pMVar4[4] + 1);
        if (pcVar9 < pcVar14) {
          do {
            if (pcVar9[-1] == '\r') {
              bVar7 = *pcVar9 == '\n';
            }
            else {
              bVar7 = false;
            }
          } while ((!bVar7) && (pcVar9 = pcVar9 + 1, pcVar9 < pcVar14));
          jVar10.object = (object_t *)(pcVar9 + -1);
        }
        else {
          bVar7 = false;
          jVar10.object = j.m_value.object;
        }
        if (bVar7) {
          local_128.owned_value._0_8_ = (long)jVar10.object - (long)j.m_value;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&,long>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_f8
                     ,(char **)&j.m_value.object,(long *)&local_128);
        }
        auVar16 = (undefined1  [8])((long)auVar16 + 4);
      } while (auVar16 != (undefined1  [8])puVar5);
    }
    ppbVar1 = &string_data.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    string_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    j.m_type = null;
    j._1_7_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)ppbVar1,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)ppbVar1,true);
    local_130 = string_data.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_f8 !=
        (undefined1  [8])
        string_data.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      auVar16 = auStack_f8;
      do {
        sha256((string *)local_1a0,(string *)auVar16);
        script_text_raw.field_2._8_8_ = auVar16;
        mg::string::bytes_to_hex((string *)((long)&digest_bytes.field_2 + 8),(string *)local_1a0);
        local_128.owned_value._0_8_ = local_128.owned_value._0_8_ & 0xffffffffffffff00;
        local_128.owned_value.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[3],_0>
                  (&local_128.owned_value,(char (*) [3])"jp");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_128.owned_value,true);
        local_128.value_ref = (value_type *)0x0;
        local_110.m_type = null;
        local_110.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_110,(string_t *)script_text_raw.field_2._8_8_);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_110,true);
        local_100 = 0;
        init._M_len = 2;
        init._M_array = &local_128;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&j.m_value,init,true,array);
        serialized_json._M_string_length = 0;
        digest_hex.field_2._M_local_buf[8] = '\0';
        j_00 = (iterator)((long)&digest_hex.field_2 + 8);
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[3],_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)j_00,(char (*) [3])"en");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)j_00,true);
        local_148.m_type = null;
        local_148.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[1],_0>
                  (&local_148,(char (*) [1])0x112179);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_148,true);
        local_138 = 0;
        init_00._M_len = 2;
        init_00._M_array = j_00;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&serialized_json.field_2,init_00,true,array);
        local_1d0.owned_value.m_type = null;
        local_1d0.owned_value.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[6],_0>
                  (&local_1d0.owned_value,(char (*) [6])"notes");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_1d0.owned_value,true);
        local_1d0.value_ref = (value_type *)0x0;
        local_1b8.m_type = null;
        local_1b8.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[1],_0>
                  (&local_1b8,(char (*) [1])0x112179);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_1b8,true);
        local_1a8 = 0;
        init_01._M_len = 2;
        init_01._M_array = &local_1d0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_a0,init_01,true,array);
        local_90 = 0;
        ppbVar1 = &mzp.entry_data.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        init_02._M_len = 3;
        init_02._M_array = (iterator)&j.m_value;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)ppbVar1,init_02,true,array);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)&string_data.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            "script_text_by_hash");
        pvVar8 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](pvVar8,(key_type *)((long)&digest_bytes.field_2 + 8));
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)ppbVar1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)ppbVar1);
        lVar15 = 0x30;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)((long)&j.m_value + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        lVar15 = 0x18;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(&local_1d0.owned_value.m_type + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        lVar15 = 0x18;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)((long)&digest_hex.field_2 + lVar15 + 8));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        lVar15 = 0x18;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(&local_128.owned_value.m_type + lVar15));
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        if ((size_type *)digest_bytes.field_2._8_8_ != &digest_hex._M_string_length) {
          operator_delete((void *)digest_bytes.field_2._8_8_,digest_hex._M_string_length + 1);
        }
        uVar6 = script_text_raw.field_2._8_8_;
        if (local_1a0 != (undefined1  [8])&digest_bytes._M_string_length) {
          operator_delete((void *)local_1a0,digest_bytes._M_string_length + 1);
        }
        auVar16 = (undefined1  [8])(uVar6 + 0x20);
      } while (auVar16 != (undefined1  [8])local_130);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump((string_t *)&j.m_value,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)&string_data.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,2,' ',false,strict);
    bVar7 = mg::fs::write_file(path,(string *)&j.m_value);
    iVar12 = 0;
    if (!bVar7) {
      fprintf(_stderr,"Failed to write \'%s\'\n",path);
      iVar12 = -1;
    }
    if (j.m_value.object != (object_t *)&serialized_json._M_string_length) {
      operator_delete(j.m_value.object,serialized_json._M_string_length + 1);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&string_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_f8);
    if (auStack_88 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_88,
                      (long)string_data_offsets.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)auStack_88);
    }
  }
  else {
    main_cold_2();
LAB_0010ae93:
    iVar12 = -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mzp.entry_headers.
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (mzp.header != (MzpArchiveHeader)0x0) {
    operator_delete((void *)mzp.header,
                    (long)mzp.entry_headers.
                          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
  }
LAB_0010ae2d:
  if (local_58 != (undefined1  [8])&script_text_raw._M_string_length) {
    operator_delete((void *)local_58,
                    CONCAT71(script_text_raw._M_string_length._1_7_,
                             (undefined1)script_text_raw._M_string_length) + 1);
  }
  return iVar12;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s script_text.mrg out.json\n", argv[0]);
    return -1;
  }

  // Name args
  const char *script_text_filename = argv[1];
  const char *output_filename = argv[2];

  // Try and load script_text
  std::string script_text_raw;
  if (!mg::fs::read_file(script_text_filename, script_text_raw)) {
    fprintf(stderr, "Failed to read script text from '%s'\n",
            script_text_filename);
    return -1;
  }

  // Attempt to parse script text as MZP archive
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(script_text_raw, mzp)) {
    fprintf(stderr, "Failed to parse script data as MZP\n");
    return -1;
  }

  // The script text consists of 10 entries, consisting of 5 pairs of string
  // table offsets / string table data.
  // All of the string tables other than the first pair seem to just contain a
  // \r\n and nothing else.
  if (mzp.entry_data.size() < 2) {
    fprintf(stderr, "Script data does not contain enough entries\n");
    return -1;
  }

  // Extract the string offset table
  const std::string &string_offsets_raw = mzp.entry_data[0];
  const uint32_t *string_offsets_u32 =
      reinterpret_cast<const uint32_t *>(string_offsets_raw.data());
  const unsigned string_offset_count =
      string_offsets_raw.size() / sizeof(uint32_t);
  std::vector<uint32_t> string_data_offsets;
  string_data_offsets.resize(string_offset_count);
  for (unsigned i = 0; i < string_offset_count; i++) {
    string_data_offsets[i] = mg::be_to_host_u32(string_offsets_u32[i]);
  }

  // Now that we have offsets, iterate the string data and extract from each
  // start offset until we hit \r\n
  const std::string &string_data_raw = mzp.entry_data[1];
  const char *const end_ptr = &string_data_raw[string_data_raw.size() - 1];
  std::vector<std::string> string_data;
  for (uint32_t offset : string_data_offsets) {
    // Get a pointer to the start of string
    const char *const start = &string_data_raw[offset];

    // Seek for \r\n
    const char *seek_r = start;
    const char *seek_n = start + 1;
    bool found_end = false;
    while (seek_n < end_ptr &&
           !(found_end = (*seek_r == '\r' && *seek_n == '\n'))) {
      seek_r++;
      seek_n++;
    }

    // Scoop the data from start to seek_r into a string
    if (found_end) {
      string_data.emplace_back(start, seek_r - start);
    }
  }

  // Generate a content hash for each string and encode as json
  nlohmann::json j;
  for (auto &string : string_data) {
    const std::string digest_bytes = sha256(string);
    const std::string digest_hex = mg::string::bytes_to_hex(digest_bytes);
    j["script_text_by_hash"][digest_hex] = {
        {"jp", string},
        {"en", ""},
        {"notes", ""},
    };
  }

  // Serialize and emit
  const std::string serialized_json = j.dump(2);
  if (!mg::fs::write_file(output_filename, serialized_json)) {
    fprintf(stderr, "Failed to write '%s'\n", output_filename);
    return -1;
  }

  return 0;
}